

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveAsciiDump.h
# Opt level: O2

ChStreamOutAscii *
chrono::operator<<(ChStreamOutAscii *mstream,vector<double,_std::allocator<double>_> *obj)

{
  ChStreamOutAscii *pCVar1;
  string mystring;
  vector<char,_std::allocator<char>_> mvect;
  ChStreamOutAsciiVector mtempstream;
  ChArchiveAsciiDump marchive;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  _Vector_base<char,_std::allocator<char>_> local_198;
  undefined1 local_180 [24];
  ChStreamOutAscii local_168 [32];
  ChNameValue<std::vector<double,_std::allocator<double>_>_> local_148;
  ChArchiveAsciiDump local_130;
  
  local_198._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ChStreamOutAsciiVector::ChStreamOutAsciiVector
            ((ChStreamOutAsciiVector *)local_180,(vector<char,_std::allocator<char>_> *)&local_198);
  ChStreamOutAscii::SetNumFormat(local_168,(char *)(mstream + 8));
  ChArchiveAsciiDump::ChArchiveAsciiDump(&local_130,local_168);
  local_130.super_ChArchiveOut.cut_all_pointers = true;
  local_130.suppress_names = true;
  local_148._name = "";
  local_130.super_ChArchiveOut.super_ChArchive.use_versions = false;
  local_148._flags = '\0';
  local_148._value = obj;
  ChArchiveOut::operator<<(&local_130.super_ChArchiveOut,&local_148);
  local_1b8[0] = local_1a8;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)local_1b8,*(undefined8 *)local_180._8_8_,*(undefined8 *)(local_180._8_8_ + 8)
            );
  pCVar1 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(mstream,(string *)local_1b8);
  std::__cxx11::string::~string((string *)local_1b8);
  ChArchiveOut::~ChArchiveOut(&local_130.super_ChArchiveOut);
  ChStreamOutAsciiVector::~ChStreamOutAsciiVector((ChStreamOutAsciiVector *)local_180);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_198);
  return pCVar1;
}

Assistant:

ChStreamOutAscii & operator<<(ChStreamOutAscii &mstream, const T& obj) {
    std::vector<char> mvect;
    ChStreamOutAsciiVector mtempstream(&mvect);
    mtempstream.SetNumFormat(mstream.GetNumFormat());
    ChArchiveAsciiDump marchive(mtempstream);
    // this avoids printing too much except the object:
    marchive.SetCutAllPointers(true);
    marchive.SetSuppressNames(true);
    marchive.SetUseVersions(false);
    marchive << CHNVP(obj,"");
    std::string mystring(mtempstream.GetVector()->begin(),mtempstream.GetVector()->end());
    return mstream << mystring;
}